

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

_Bool ggml_gallocr_alloc_graph(ggml_gallocr_t galloc,ggml_cgraph *graph)

{
  _Bool _Var1;
  long in_RSI;
  long in_RDI;
  ggml_tensor *src;
  int j;
  node_alloc *node_alloc;
  ggml_tensor *node;
  int i_2;
  leaf_alloc *leaf_alloc;
  ggml_tensor *leaf;
  int i_1;
  int i;
  ggml_cgraph *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  tensor_alloc *in_stack_ffffffffffffffc0;
  tensor_alloc *tensor_alloc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  ggml_gallocr_t in_stack_ffffffffffffffd0;
  ggml_gallocr_t in_stack_ffffffffffffffd8;
  int local_20;
  int local_1c;
  
  _Var1 = ggml_gallocr_needs_realloc
                    (in_stack_ffffffffffffffd8,(ggml_cgraph *)in_stack_ffffffffffffffd0);
  if (_Var1) {
    if (*(int *)(in_RDI + 0x18) != 1) {
      return false;
    }
    _Var1 = ggml_gallocr_reserve
                      ((ggml_gallocr_t)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                       ,in_stack_ffffffffffffffa8);
    if (!_Var1) {
      return false;
    }
  }
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x18); local_1c = local_1c + 1) {
    if (*(long *)(*(long *)(in_RDI + 8) + (long)local_1c * 8) != 0) {
      ggml_backend_buffer_reset((ggml_backend_buffer_t)0x15c25b);
    }
  }
  for (local_20 = 0; local_20 < *(int *)(in_RSI + 8); local_20 = local_20 + 1) {
    in_stack_ffffffffffffffd0 = (ggml_gallocr_t)(*(long *)(in_RDI + 0x50) + (long)local_20 * 0x18);
    ggml_gallocr_init_tensor
              (in_stack_ffffffffffffffd0,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0);
  }
  for (iVar3 = 0; iVar3 < *(int *)(in_RSI + 4); iVar3 = iVar3 + 1) {
    tensor_alloc = *(tensor_alloc **)(*(long *)(in_RSI + 0x10) + (long)iVar3 * 8);
    for (iVar2 = 0; iVar2 < 10; iVar2 = iVar2 + 1) {
      if ((&tensor_alloc[6].offset)[iVar2] != 0) {
        ggml_gallocr_init_tensor
                  (in_stack_ffffffffffffffd0,
                   (ggml_tensor *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),tensor_alloc);
      }
    }
    ggml_gallocr_init_tensor
              (in_stack_ffffffffffffffd0,(ggml_tensor *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
               tensor_alloc);
  }
  return true;
}

Assistant:

bool ggml_gallocr_alloc_graph(ggml_gallocr_t galloc, struct ggml_cgraph * graph) {
    if (ggml_gallocr_needs_realloc(galloc, graph)) {
        if (galloc->n_buffers == 1) {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: reallocating buffers automatically\n", __func__);
#endif
            if (!ggml_gallocr_reserve(galloc, graph)) {
                return false;
            }
        } else {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: cannot reallocate multi buffer graph automatically, call reserve\n", __func__);
#endif
            return false;
        }
    }

    // reset buffers
    for (int i = 0; i < galloc->n_buffers; i++) {
        if (galloc->buffers[i] != NULL) {
            ggml_backend_buffer_reset(galloc->buffers[i]);
        }
    }

    // allocate the graph tensors from the previous assignments
    // leafs
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        struct leaf_alloc * leaf_alloc = &galloc->leaf_allocs[i];
        ggml_gallocr_init_tensor(galloc, leaf, &leaf_alloc->leaf);
    }
    // nodes
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct node_alloc * node_alloc = &galloc->node_allocs[i];
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }
            ggml_gallocr_init_tensor(galloc, src, &node_alloc->src[j]);
        }
        ggml_gallocr_init_tensor(galloc, node, &node_alloc->dst);
    }

    return true;
}